

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O2

bool __thiscall
miniros::ServiceClient::call
          (ServiceClient *this,SerializedMessage *req,SerializedMessage *resp,string *service_md5sum
          )

{
  bool bVar1;
  bool bVar2;
  ServiceManagerPtr *pSVar3;
  element_type *peVar4;
  undefined1 local_58 [16];
  ServiceServerLinkPtr link;
  
  bVar1 = std::operator!=(service_md5sum,
                          &((this->impl_).
                            super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->service_md5sum_);
  if (bVar1) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (call::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&link,"miniros.unknown_package",(allocator<char> *)local_58);
      console::initializeLogLocation(&call::loc,(string *)&link,Error);
      std::__cxx11::string::~string((string *)&link);
    }
    if (call::loc.level_ != Error) {
      console::setLogLocationLevel(&call::loc,Error);
      console::checkLogLocationEnabled(&call::loc);
    }
    if (call::loc.logger_enabled_ != true) {
      return false;
    }
    peVar4 = (this->impl_).
             super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    console::print((FilterBase *)0x0,call::loc.logger_,call::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client.cpp"
                   ,0x71,
                   "bool miniros::ServiceClient::call(const SerializedMessage &, SerializedMessage &, const std::string &)"
                   ,
                   "Call to service [%s] with md5sum [%s] does not match md5sum when the handle was created ([%s])"
                   ,(peVar4->name_)._M_dataplus._M_p,(service_md5sum->_M_dataplus)._M_p,
                   (peVar4->service_md5sum_)._M_dataplus._M_p);
    return false;
  }
  link.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  link.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (this->impl_).
           super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4->persistent_ == true) {
    if ((peVar4->server_link_).
        super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pSVar3 = ServiceManager::instance();
      peVar4 = (this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ServiceManager::createServiceServerLink
                ((ServiceManager *)local_58,
                 (string *)
                 (pSVar3->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,(bool)((char)peVar4 + '\x10'),(string *)(ulong)peVar4->persistent_,
                 service_md5sum,(M_string *)service_md5sum);
      std::__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *)
                 (this->impl_).
                 super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,(__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *)local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      peVar4 = (this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar4->server_link_).
          super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) goto LAB_002438b3;
    }
    std::__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&link.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *)peVar4);
  }
  else {
    pSVar3 = ServiceManager::instance();
    peVar4 = (this->impl_).
             super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ServiceManager::createServiceServerLink
              ((ServiceManager *)local_58,
               (string *)
               (pSVar3->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(bool)((char)peVar4 + '\x10'),(string *)(ulong)peVar4->persistent_,
               service_md5sum,(M_string *)service_md5sum);
    std::__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&link.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    if (link.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
LAB_002438b3:
      bVar1 = false;
      goto LAB_002438b6;
    }
  }
  bVar1 = ServiceServerLink::call
                    (link.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,req,resp);
  std::__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>::reset
            (&link.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>);
  while ((bVar2 = isShuttingDown(), bVar2 && (bVar2 = ok(), bVar2))) {
    WallDuration::WallDuration((WallDuration *)local_58,0.001);
    WallDuration::sleep((WallDuration *)local_58,(uint)req);
  }
LAB_002438b6:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&link.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar1;
}

Assistant:

bool ServiceClient::call(const SerializedMessage& req, SerializedMessage& resp, const std::string& service_md5sum)
{
  if (service_md5sum != impl_->service_md5sum_)
  {
    MINIROS_ERROR("Call to service [%s] with md5sum [%s] does not match md5sum when the handle was created ([%s])", impl_->name_.c_str(), service_md5sum.c_str(), impl_->service_md5sum_.c_str());

    return false;
  }

  ServiceServerLinkPtr link;

  if (impl_->persistent_)
  {
    if (!impl_->server_link_)
    {
      impl_->server_link_ = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, service_md5sum, service_md5sum, impl_->header_values_);

      if (!impl_->server_link_)
      {
        return false;
      }
    }

    link = impl_->server_link_;
  }
  else
  {
    link = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, service_md5sum, service_md5sum, impl_->header_values_);

    if (!link)
    {
      return false;
    }
  }

  bool ret = link->call(req, resp);
  link.reset();

  // If we're shutting down but the node haven't finished yet, wait until we do
  while (miniros::isShuttingDown() && miniros::ok())
  {
    miniros::WallDuration(0.001).sleep();
  }

  return ret;
}